

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_ffh_pcall(lua_State *L)

{
  undefined8 in_RDI;
  int narg;
  
  narg = (int)((ulong)in_RDI >> 0x20);
  lj_lib_checkany(L,narg);
  lj_lib_checkfunc(L,narg);
  return 0;
}

Assistant:

LJLIB_ASM(pcall)		LJLIB_REC(.)
{
  lj_lib_checkany(L, 1);
  lj_lib_checkfunc(L, 2);  /* For xpcall only. */
  return FFH_UNREACHABLE;
}